

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int rehash(stmm_table *table)

{
  ulong uVar1;
  stmm_table_entry **__ptr;
  stmm_table_entry *psVar2;
  stmm_hash_func_type p_Var3;
  int iVar4;
  stmm_table_entry **ppsVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  stmm_table_entry *psVar11;
  
  uVar1._0_4_ = table->num_bins;
  uVar1._4_4_ = table->num_entries;
  __ptr = table->bins;
  uVar10 = (uint)((double)(int)(undefined4)uVar1 * table->grow_factor);
  uVar8 = uVar10 | 1;
  table->num_bins = uVar8;
  table->num_entries = 0;
  ppsVar5 = (stmm_table_entry **)malloc((long)(int)uVar8 << 3);
  table->bins = ppsVar5;
  if (ppsVar5 == (stmm_table_entry **)0x0) {
    table->bins = __ptr;
    table->num_bins = (undefined4)uVar1;
    table->num_entries = uVar1._4_4_;
    iVar6 = -10000;
  }
  else {
    if (-1 < (int)uVar10) {
      uVar7 = 0;
      do {
        table->bins[uVar7] = (stmm_table_entry *)0x0;
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    if (0 < (int)(undefined4)uVar1) {
      iVar6 = 0;
      uVar7 = 0;
      do {
        psVar11 = __ptr[uVar7];
        while (psVar11 != (stmm_table_entry *)0x0) {
          psVar2 = psVar11->next;
          p_Var3 = table->hash;
          if (p_Var3 == stmm_ptrhash) {
            iVar4 = (int)(((ulong)psVar11->key >> 2) % (ulong)(long)table->num_bins);
          }
          else if (p_Var3 == stmm_numhash) {
            iVar9 = (int)psVar11->key;
            iVar4 = -iVar9;
            if (0 < iVar9) {
              iVar4 = iVar9;
            }
            iVar4 = iVar4 % table->num_bins;
          }
          else {
            iVar4 = (*p_Var3)(psVar11->key,table->num_bins);
            iVar6 = table->num_entries;
          }
          ppsVar5 = table->bins;
          psVar11->next = ppsVar5[iVar4];
          ppsVar5[iVar4] = psVar11;
          iVar6 = iVar6 + 1;
          table->num_entries = iVar6;
          psVar11 = psVar2;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uVar1 & 0xffffffff));
    }
    iVar6 = 1;
    if (__ptr != (stmm_table_entry **)0x0) {
      free(__ptr);
    }
  }
  return iVar6;
}

Assistant:

static int
rehash( st__table *table)
{
    st__table_entry *ptr, *next, **old_bins;
    int             i, old_num_bins, hash_val, old_num_entries;

    /* save old values */
    old_bins = table->bins;
    old_num_bins = table->num_bins;
    old_num_entries = table->num_entries;

    /* rehash */
    table->num_bins = (int)(table->grow_factor * old_num_bins);
    if (table->num_bins % 2 == 0) {
    table->num_bins += 1;
    }
    table->num_entries = 0;
    table->bins = ABC_ALLOC( st__table_entry *, table->num_bins);
    if (table->bins == NULL) {
    table->bins = old_bins;
    table->num_bins = old_num_bins;
    table->num_entries = old_num_entries;
    return st__OUT_OF_MEM;
    }
    /* initialize */
    for (i = 0; i < table->num_bins; i++) {
    table->bins[i] = 0;
    }

    /* copy data over */
    for (i = 0; i < old_num_bins; i++) {
    ptr = old_bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        hash_val = do_hash(ptr->key, table);
        ptr->next = table->bins[hash_val];
        table->bins[hash_val] = ptr;
        table->num_entries++;
        ptr = next;
    }
    }
    ABC_FREE(old_bins);

    return 1;
}